

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

size_t fiobj_str_write(FIOBJ dest,char *data,size_t len)

{
  fio_str_s_conflict *s;
  ulong needed;
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  fio_str_info_s local_40;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                  ,0xf6,"size_t fiobj_str_write(FIOBJ, const char *, size_t)");
  }
  uVar3 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar3 + 0x11) != '\0') {
    return 0;
  }
  s = (fio_str_s_conflict *)(uVar3 + 0x10);
  *(undefined8 *)(uVar3 + 8) = 0;
  if ((data == (char *)0x0 || len == 0) || (*(char *)(uVar3 + 0x11) != '\0')) {
    if ((s->small == 0) && (*(long *)(uVar3 + 0x38) != 0)) {
      return *(size_t *)(uVar3 + 0x28);
    }
    return (ulong)(s->small >> 1);
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (*(long *)(uVar3 + 0x38) != 0)) {
    uVar5 = *(ulong *)(uVar3 + 0x28);
  }
  else {
    uVar5 = (ulong)(bVar1 >> 1);
  }
  needed = len + uVar5;
  if ((bVar1 == 0) && (*(long *)(uVar3 + 0x38) != 0)) {
    uVar2 = *(ulong *)(uVar3 + 0x20);
    if (uVar2 <= needed) {
      if (*(long *)(uVar3 + 0x30) == 0) {
        uVar2 = *(ulong *)(uVar3 + 0x28);
      }
      *(ulong *)(uVar3 + 0x28) = uVar2;
      goto LAB_0011fff6;
    }
  }
  else {
    if (needed < 0x2e) {
      *(char *)(uVar3 + 0x10) = (char)needed * '\x02' + '\x01';
      *(undefined1 *)(uVar3 + 0x12 + needed) = 0;
      lVar4 = uVar3 + 0x12;
      goto LAB_00120014;
    }
    s->small = '[';
LAB_0011fff6:
    fio_str_capa_assert(&local_40,s,needed);
  }
  *(ulong *)(uVar3 + 0x28) = needed;
  *(undefined1 *)(*(long *)(uVar3 + 0x38) + needed) = 0;
  lVar4 = *(long *)(uVar3 + 0x38);
LAB_00120014:
  memcpy((void *)(lVar4 + uVar5),data,len);
  return needed;
}

Assistant:

size_t fiobj_str_write(FIOBJ dest, const char *data, size_t len) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write(&obj2str(dest)->str, data, len).len;
}